

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall
initiatorCreatedBeforeStartTimeFixture::initiatorCreatedBeforeStartTimeFixture
          (initiatorCreatedBeforeStartTimeFixture *this)

{
  string *beginString;
  undefined1 auVar1 [16];
  Session *pSVar2;
  ulong uVar3;
  long lVar4;
  long *local_758;
  long local_750;
  long local_748 [2];
  long *local_738;
  long local_730;
  long local_728 [2];
  long *local_718;
  long local_710;
  long local_708 [2];
  string local_6f8;
  initiatorCreatedBeforeStartTimeFixture *local_6d8;
  undefined8 uStack_6d0;
  code *local_6c8;
  code *pcStack_6c0;
  undefined1 local_6b0 [16];
  string local_6a0;
  _Alloc_hider local_680;
  size_type local_678;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_670;
  field_metrics local_660;
  undefined1 local_658 [16];
  string local_648;
  _Alloc_hider local_628;
  size_type local_620;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_618;
  field_metrics local_608;
  SessionID sessionID;
  TimeRange sessionTime;
  DataDictionaryProvider provider;
  
  anon_unknown.dwarf_5319c9::TestCallback::TestCallback(&this->super_TestCallback);
  (this->super_TestCallback).super_Responder._vptr_Responder =
       (_func_int **)&PTR__initiatorCreatedBeforeStartTimeFixture_0032e360;
  (this->super_TestCallback).super_NullApplication.super_Application._vptr_Application =
       (_func_int **)&PTR__initiatorCreatedBeforeStartTimeFixture_0032e3b0;
  this->actuallySent = 0;
  this->actuallySentLogon = false;
  *(code **)&this->messageStoreFactory = FIX::SocketServer::accept;
  FIX::DateTime::nowUtc();
  (this->super_TestCallback).now.super_DateTime.m_date =
       provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  (this->super_TestCallback).now.super_DateTime.m_time =
       (int64_t)provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent;
  (this->super_TestCallback).startTime.super_DateTime.m_date = 0;
  *(undefined8 *)&(this->super_TestCallback).startTime.super_DateTime.field_0xc =
       *(undefined8 *)&(this->super_TestCallback).now.super_DateTime.field_0xc;
  *(undefined4 *)((long)&(this->super_TestCallback).startTime.super_DateTime.m_time + 4) =
       *(undefined4 *)((long)&(this->super_TestCallback).now.super_DateTime.m_time + 4);
  auVar1 = SEXT816((this->super_TestCallback).startTime.super_DateTime.m_time) *
           SEXT816(0x112e0be826d694b3);
  lVar4 = (long)((int)(auVar1._8_8_ >> 0x1a) - (auVar1._12_4_ >> 0x1f));
  lVar4 = (lVar4 / 0xe10) * -0xe10 + (lVar4 / 0xe10) * 0xe10 + lVar4;
  uVar3 = lVar4 * 1000000000 + 2000000000;
  (this->super_TestCallback).startTime.super_DateTime.m_time = uVar3;
  if (lVar4 < 0x1517e) {
    if (lVar4 < -2) {
      (this->super_TestCallback).startTime.super_DateTime.m_date = -1;
      uVar3 = lVar4 * 1000000000 + 0x4e9508849400;
      goto LAB_00285a23;
    }
  }
  else {
    (this->super_TestCallback).startTime.super_DateTime.m_date = 1;
    uVar3 = uVar3 % 86400000000000;
LAB_00285a23:
    (this->super_TestCallback).startTime.super_DateTime.m_time = uVar3;
  }
  (this->super_TestCallback).endTime.super_DateTime.m_date = 0;
  *(undefined8 *)&(this->super_TestCallback).endTime.super_DateTime.field_0xc =
       *(undefined8 *)&(this->super_TestCallback).now.super_DateTime.field_0xc;
  *(undefined4 *)((long)&(this->super_TestCallback).endTime.super_DateTime.m_time + 4) =
       *(undefined4 *)((long)&(this->super_TestCallback).now.super_DateTime.m_time + 4);
  auVar1 = SEXT816((this->super_TestCallback).endTime.super_DateTime.m_time) *
           SEXT816(0x112e0be826d694b3);
  lVar4 = (long)((int)(auVar1._8_8_ >> 0x1a) - (auVar1._12_4_ >> 0x1f));
  lVar4 = (lVar4 / 0xe10) * -0xe10 + (lVar4 / 0xe10) * 0xe10 + lVar4;
  (this->super_TestCallback).endTime.super_DateTime.m_date = 0;
  uVar3 = lVar4 * 1000000000 + 4000000000;
  (this->super_TestCallback).endTime.super_DateTime.m_time = uVar3;
  if (lVar4 < 0x1517c) {
    if (-5 < lVar4) goto LAB_00285b2b;
    (this->super_TestCallback).endTime.super_DateTime.m_date = -1;
    uVar3 = lVar4 * 1000000000 + 0x4e957fba2800;
  }
  else {
    (this->super_TestCallback).endTime.super_DateTime.m_date = 1;
    uVar3 = uVar3 % 86400000000000;
  }
  (this->super_TestCallback).endTime.super_DateTime.m_time = uVar3;
LAB_00285b2b:
  FIX::TimeRange::TimeRange
            (&sessionTime,&(this->super_TestCallback).startTime,&(this->super_TestCallback).endTime,
             -1,-1);
  local_738 = local_728;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"FIX.4.2","");
  beginString = (string *)
                &provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_parent;
  provider.m_transportDictionaries._M_t._M_impl._0_8_ = &PTR__FieldBase_003239f8;
  provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 8;
  provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       &provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  std::__cxx11::string::_M_construct<char*>
            ((string *)beginString,local_738,local_730 + (long)local_738);
  provider.m_applicationDictionaries._M_t._M_impl._0_8_ =
       &provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
       0;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  provider.m_transportDictionaries._M_t._M_impl._0_8_ = &PTR__FieldBase_00328470;
  local_758 = local_748;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_758,"MJKG","");
  local_658._0_8_ = &PTR__FieldBase_003239f8;
  local_658._8_4_ = 0x31;
  local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_648,local_758,local_750 + (long)local_758);
  local_628._M_p = (pointer)&local_618;
  local_620 = 0;
  local_618._M_local_buf[0] = '\0';
  local_608.m_length = 0;
  local_608.m_checksum = 0;
  local_658._0_8_ = &PTR__FieldBase_00327af0;
  local_718 = local_708;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_718,"IZZY","");
  local_6b0._0_8_ = &PTR__FieldBase_003239f8;
  local_6b0._8_4_ = 0x38;
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_6a0,local_718,local_710 + (long)local_718);
  local_680._M_p = (pointer)&local_670;
  local_678 = 0;
  local_670._M_local_buf[0] = '\0';
  local_660.m_length = 0;
  local_660.m_checksum = 0;
  local_6b0._0_8_ = &PTR__FieldBase_00327ee0;
  local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"");
  FIX::SessionID::SessionID(&sessionID,beginString,&local_648,&local_6a0,&local_6f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
    operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_6b0);
  if (local_718 != local_708) {
    operator_delete(local_718,local_708[0] + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_658);
  if (local_758 != local_748) {
    operator_delete(local_758,local_748[0] + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&provider);
  if (local_738 != local_728) {
    operator_delete(local_738,local_728[0] + 1);
  }
  FIX::DataDictionaryProvider::DataDictionaryProvider(&provider);
  local_6b0._0_8_ = &local_6a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6b0,"FIX42","");
  FIX::TestSettings::pathForSpec((string *)local_658,(string *)local_6b0);
  FIX::DataDictionaryProvider::addTransportDataDictionary
            (&provider,&sessionID.m_beginString,(string *)local_658);
  if ((string *)local_658._0_8_ != &local_648) {
    operator_delete((void *)local_658._0_8_,(ulong)(local_648._M_dataplus._M_p + 1));
  }
  if ((string *)local_6b0._0_8_ != &local_6a0) {
    operator_delete((void *)local_6b0._0_8_,(ulong)(local_6a0._M_dataplus._M_p + 1));
  }
  pSVar2 = (Session *)operator_new(0x878);
  uStack_6d0 = 0;
  pcStack_6c0 = std::
                _Function_handler<FIX::UtcTimeStamp_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/SessionTestCase.cpp:2585:9)>
                ::_M_invoke;
  local_6c8 = std::
              _Function_handler<FIX::UtcTimeStamp_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/SessionTestCase.cpp:2585:9)>
              ::_M_manager;
  local_6d8 = this;
  FIX::Session::Session
            (pSVar2,&local_6d8,&(this->super_TestCallback).super_NullApplication,
             &this->messageStoreFactory,&sessionID,&provider,&sessionTime,0x1e,0);
  this->object = pSVar2;
  if (local_6c8 != (code *)0x0) {
    (*local_6c8)(&local_6d8,&local_6d8,3);
  }
  FIX::DataDictionary::~DataDictionary(&provider.emptyDataDictionary);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
  ::~_Rb_tree(&provider.m_applicationDictionaries._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
               *)&provider);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sessionID.m_frozenString._M_dataplus._M_p != &sessionID.m_frozenString.field_2) {
    operator_delete(sessionID.m_frozenString._M_dataplus._M_p,
                    sessionID.m_frozenString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sessionID.m_sessionQualifier._M_dataplus._M_p != &sessionID.m_sessionQualifier.field_2) {
    operator_delete(sessionID.m_sessionQualifier._M_dataplus._M_p,
                    sessionID.m_sessionQualifier.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionID.m_targetCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionID.m_senderCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionID);
  return;
}

Assistant:

initiatorCreatedBeforeStartTimeFixture()
      : actuallySent(0),
        actuallySentLogon(false) {
    now.setCurrent();
    startTime = now;
    startTime.setMillisecond(0);
    startTime += STARTTIMEFROMNOW;
    endTime = now;
    endTime.setMillisecond(0);
    endTime += ENDTIMEFROMNOW;
    TimeRange sessionTime(startTime, endTime);

    SessionID sessionID(BeginString("FIX.4.2"), SenderCompID("MJKG"), TargetCompID("IZZY"));

    DataDictionaryProvider provider;
    provider.addTransportDataDictionary(sessionID.getBeginString(), FIX::TestSettings::pathForSpec("FIX42"));
    object = new Session(
        [this]() { return now; },
        *this,
        messageStoreFactory,
        sessionID,
        provider,
        sessionTime,
        HEARTBTINT,
        0);
  }